

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_c_zvpbeint.c
# Opt level: O0

void gga_c_zvpbeint_init(xc_func_type *p)

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 *in_RDI;
  gga_c_zvpbeint_params *params;
  
  pvVar2 = malloc(0x18);
  in_RDI[0x2f] = pvVar2;
  puVar1 = (undefined8 *)in_RDI[0x2f];
  if (*(int *)*in_RDI == 0x22d) {
    *puVar1 = 0x3faa9fbe76c8b439;
    puVar1[1] = 0x3ff0000000000000;
    puVar1[2] = 0x4012000000000000;
  }
  else {
    if (*(int *)*in_RDI != 0x22e) {
      fprintf(_stderr,"Internal error in gga_c_zvpbeint\n");
      exit(1);
    }
    *puVar1 = 0x3fa78d4fdf3b645a;
    puVar1[1] = 0x3ffccccccccccccd;
    puVar1[2] = 0x4012000000000000;
  }
  return;
}

Assistant:

static void
gga_c_zvpbeint_init(xc_func_type *p)
{
  gga_c_zvpbeint_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_c_zvpbeint_params));
  params = (gga_c_zvpbeint_params *) (p->params);

  switch(p->info->number){
  case XC_GGA_C_ZVPBEINT:
    params->beta  = 0.052;
    params->alpha = 1.0;
    params->omega = 4.5;
    break;
  case XC_GGA_C_ZVPBESOL:
    params->beta  = 0.046;
    params->alpha = 1.8;
    params->omega = 4.5;
    break;
  default:
    fprintf(stderr, "Internal error in gga_c_zvpbeint\n");
    exit(1);
  }
}